

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioVoice_SetVolume(FAudioVoice *voice,float Volume,uint32_t OperationSet)

{
  float fVar1;
  
  fVar1 = -16777216.0;
  if (-16777216.0 <= Volume) {
    fVar1 = Volume;
  }
  voice->volume =
       (float)(-(uint)(16777216.0 < Volume) & 0x4b800000 |
              ~-(uint)(16777216.0 < Volume) & (uint)fVar1);
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetVolume(
	FAudioVoice *voice,
	float Volume,
	uint32_t OperationSet
) {
	LOG_API_ENTER(voice->audio)
	FAudio_assert(OperationSet == FAUDIO_COMMIT_NOW);

	voice->volume = FAudio_clamp(
		Volume,
		-FAUDIO_MAX_VOLUME_LEVEL,
		FAUDIO_MAX_VOLUME_LEVEL
	);
	LOG_API_EXIT(voice->audio)
	return 0;
}